

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketProcessor.cpp
# Opt level: O2

bool __thiscall PacketProcessor::findHeader(PacketProcessor *this)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  bVar6 = true;
  if (this->findHeader_ == false) {
    puVar1 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar4 = (long)puVar2 - (long)puVar1;
    uVar5 = 1;
    for (lVar3 = 0; (long)puVar1 - (long)puVar2 != lVar3; lVar3 = lVar3 + -1) {
      if (puVar1[uVar5 - 1] == 'Z') {
        if (uVar4 <= uVar5) {
          bVar6 = (ulong)-lVar3 < uVar4;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->buffer_,
                     puVar2 + -1);
          lVar3 = 0;
          goto LAB_00103bef;
        }
        if (puVar1[uVar5] == 0xa5) {
          bVar6 = (ulong)-lVar3 < uVar4;
          if (lVar3 != 0) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->buffer_,
                       (long)puVar1 - lVar3);
          }
          this->findHeader_ = true;
          lVar3 = 1;
          goto LAB_00103bef;
        }
      }
      uVar5 = uVar5 + 1;
    }
    bVar6 = false;
LAB_00103bef:
    bVar6 = (bool)(bVar6 & (byte)lVar3);
  }
  return bVar6;
}

Assistant:

bool PacketProcessor::findHeader() {
  if (findHeader_) return true;

  FOR(i, buffer_.size()) {
    if (buffer_[i] == H_1) {
      if (i + 1 < buffer_.size()) {
        if (buffer_[i + 1] == H_2) {
          if (i != 0) {
            buffer_.assign(buffer_.cbegin() + i, buffer_.cend());
          }
          findHeader_ = true;
          return true;
        }
      } else {
        buffer_.assign(buffer_.cend() - 1, buffer_.cend());
        return false;
      }
    }
  }

  return false;
}